

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

bool __thiscall QFormLayout::hasHeightForWidth(QFormLayout *this)

{
  RowWrapPolicy RVar1;
  QFormLayoutPrivate *pQVar2;
  QFormLayout *in_RDI;
  QFormLayoutPrivate *e;
  QFormLayoutPrivate *d;
  QFormLayoutPrivate *in_stack_000000b0;
  bool local_19;
  
  pQVar2 = d_func((QFormLayout *)0x4b6e2b);
  QFormLayoutPrivate::updateSizes(in_stack_000000b0);
  local_19 = true;
  if ((*(uint *)&pQVar2->field_0xb0 >> 0x10 & 3) == 0) {
    RVar1 = rowWrapPolicy(in_RDI);
    local_19 = RVar1 == WrapLongRows;
  }
  return local_19;
}

Assistant:

bool QFormLayout::hasHeightForWidth() const
{
    Q_D(const QFormLayout);
    QFormLayoutPrivate *e = const_cast<QFormLayoutPrivate *>(d);
    e->updateSizes();
    return (d->has_hfw || rowWrapPolicy() == WrapLongRows);
}